

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_calc_binningde(fitsfile *fptr,int naxis,char (*colname) [71],char **colexpr,double *minin,
                       double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
                       char (*binname) [71],int *colnum,int *datatypes,long *haxes,double *amin,
                       double *amax,double *binsize,long *repeat,int *status)

{
  char *pcVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  char *pcVar10;
  char (*pacVar11) [71];
  long lVar12;
  char *__dest;
  char *__dest_00;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  char (*local_3c0) [71];
  int datatype;
  int tstatus;
  undefined8 local_3a0;
  int *local_398;
  char (*local_390) [71];
  ulong local_388;
  char (*local_380) [71];
  double datamax;
  long repeat1;
  long local_368;
  char (*local_360) [71];
  int *local_358;
  char (*local_350) [71];
  long nelem;
  double datamin;
  double *local_338;
  double *local_330;
  long local_328;
  int naxis_1;
  char errmsg [81];
  char keyname [75];
  long naxes [5];
  char cpref [4] [71];
  ParseData lParse;
  
  iVar4 = *status;
  if (iVar4 < 1) {
    uVar9 = (ulong)(uint)naxis;
    if (repeat != (long *)0x0) {
      *repeat = 0;
    }
    if (naxis < 5) {
      local_330 = maxin;
      if (fptr->HDUposition != fptr->Fptr->curhdu) {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      local_360 = cpref;
      cpref[0][0] = '\0';
      cpref[1][0] = '\0';
      cpref[2][0] = '\0';
      local_3a0 = 0;
      cpref[3][0] = '\0';
      tstatus = 0;
      ffgky(fptr,0x10,"CPREF",local_360,(char *)0x0,&tstatus);
      if (tstatus == 0) {
        __dest = cpref[1];
        __dest_00 = cpref[2];
        pcVar10 = cpref[0];
LAB_001b6b43:
        if (*pcVar10 == '\0') goto LAB_001b622e;
        if (*pcVar10 != ',') goto code_r0x001b6b53;
        *pcVar10 = '\0';
        do {
          pcVar1 = pcVar10 + 1;
          pcVar10 = pcVar10 + 1;
        } while (*pcVar1 == ' ');
        strcpy(__dest,pcVar10);
LAB_001b6b6d:
        if (*__dest != '\0') {
          if (*__dest != ',') goto code_r0x001b6b83;
          *__dest = '\0';
          do {
            pcVar10 = __dest + 1;
            __dest = __dest + 1;
          } while (*pcVar10 == ' ');
          strcpy(__dest_00,__dest);
          while( true ) {
            if (*__dest_00 == '\0') goto LAB_001b622e;
            if (*__dest_00 == ',') break;
            __dest_00 = __dest_00 + 1;
          }
          *__dest_00 = '\0';
          do {
            pcVar10 = __dest_00 + 1;
            __dest_00 = __dest_00 + 1;
          } while (*pcVar10 == ' ');
          strcpy(cpref[3],__dest_00);
        }
      }
LAB_001b622e:
      local_350 = maxname;
      if (naxis < 1) {
        uVar9 = 0;
      }
      local_328 = uVar9 << 3;
      local_368 = 0;
      local_388 = 0;
      piVar8 = colnum;
      local_3c0 = colname;
      local_338 = minin;
      for (lVar12 = 0; local_328 != lVar12; lVar12 = lVar12 + 8) {
        local_390 = minname;
        local_380 = binname;
        local_358 = piVar8;
        if ((*local_3c0)[0] != '\0') {
LAB_001b62bd:
          *piVar8 = 0;
          if (colexpr == (char **)0x0) {
            bVar3 = true;
          }
          else {
            pcVar10 = *(char **)((long)colexpr + lVar12);
            piVar7 = piVar8;
            if (pcVar10 != (char *)0x0) goto LAB_001b6317;
            bVar3 = false;
          }
LAB_001b6412:
          iVar4 = ffgcno(fptr,0,*local_3c0,piVar8,status);
          if (iVar4 < 1) {
            local_398 = piVar8;
            ffeqty(fptr,*piVar8,&datatype,&repeat1,(long *)0x0,status);
            goto LAB_001b6451;
          }
          builtin_strncpy(errmsg + 0x20,"t exist: ",10);
          builtin_strncpy(errmsg + 0x10,"gram axis doesn\'",0x10);
          builtin_strncpy(errmsg,"column for histo",0x10);
          sVar6 = strlen(errmsg);
          strncat(errmsg,*local_3c0,0x50 - sVar6);
LAB_001b6d45:
          pacVar11 = (char (*) [71])errmsg;
LAB_001b6d48:
          ffpmsg(*pacVar11);
          break;
        }
        if (((colexpr == (char **)0x0) ||
            (pcVar10 = *(char **)((long)colexpr + lVar12), pcVar10 == (char *)0x0)) ||
           (*pcVar10 == '\0')) {
          strcpy(*local_3c0,*local_360);
          if (local_388 < 4 && (*local_3c0)[0] == '\0') {
            *(short *)*local_3c0 = (short)(0x54005a00590058 >> ((byte)local_368 & 0x3f));
          }
          goto LAB_001b62bd;
        }
        piVar7 = colnum + local_388;
        *piVar8 = 0;
LAB_001b6317:
        if (*pcVar10 == '\0') {
          bVar3 = false;
          piVar8 = piVar7;
          goto LAB_001b6412;
        }
        local_398 = piVar7;
        iVar4 = ffiprs(fptr,0,pcVar10,5,&datatype,&nelem,&naxis_1,naxes,&lParse,status);
        if (iVar4 != 0) {
          snprintf(errmsg,0x51,"Parser error of binning expression: %s",
                   *(undefined8 *)((long)colexpr + lVar12));
          goto LAB_001b6d45;
        }
        if (nelem < 0) {
          nelem = 1;
        }
        repeat1 = nelem;
        ffcprs(&lParse);
        bVar3 = false;
LAB_001b6451:
        pacVar11 = local_390;
        if ((datatype < 0) || (datatype == 0x10)) {
          builtin_strncpy(errmsg + 0x20,"n this column: ",0x10);
          builtin_strncpy(errmsg + 0x10,"tatype; can\'t bi",0x10);
          builtin_strncpy(errmsg,"Inappropriate da",0x10);
          sVar6 = strlen(errmsg);
          strncat(errmsg,*local_3c0,0x50 - sVar6);
          ffpmsg(errmsg);
          *status = 0x19a;
          return 0x19a;
        }
        if (repeat != (long *)0x0) {
          if (lVar12 == 0) {
            *repeat = repeat1;
          }
          else if (*repeat != repeat1) {
            builtin_strncpy(errmsg + 0x20,"o not agree",0xc);
            builtin_strncpy(errmsg + 0x10," input columns d",0x10);
            builtin_strncpy(errmsg,"Vector repeat of",0x10);
            ffpmsg(errmsg);
            *status = 0x140;
            goto LAB_001b61a5;
          }
        }
        if (datatypes != (int *)0x0) {
          datatypes[local_388] = datatype;
        }
        datamin = -9.1191291391491e-36;
        datamax = -9.1191291391491e-36;
        if (((*local_390)[0] != '\0') &&
           (iVar4 = ffgky(fptr,0x52,*local_390,(void *)((long)minin + lVar12),(char *)0x0,status),
           iVar4 != 0)) {
          ffpmsg("error reading histogramming minimum keyword");
          goto LAB_001b6d48;
        }
        dVar17 = *(double *)((long)minin + lVar12);
        if ((dVar17 != -9.1191291391491e-36) || (NAN(dVar17))) {
          *(double *)((long)amin + lVar12) = dVar17;
          goto LAB_001b65f9;
        }
        if (((!bVar3) && (pcVar10 = *(char **)((long)colexpr + lVar12), pcVar10 != (char *)0x0)) &&
           (*pcVar10 != '\0')) {
          pdVar2 = (double *)((long)amin + lVar12);
          iVar4 = fits_get_expr_minmax(fptr,pcVar10,pdVar2,&datamax,(int *)0x0,status);
          if (iVar4 < 1) {
            if ((*pdVar2 == -9.1191291391491e-36) && (!NAN(*pdVar2))) {
              *pdVar2 = 0.0;
            }
            goto LAB_001b65f9;
          }
LAB_001b6db1:
          builtin_strncpy(errmsg,"Error calculating datamin and datamax for expression: ",0x37);
          ffpmsg(errmsg);
          pcVar10 = *(char **)((long)colexpr + lVar12);
LAB_001b6df5:
          ffpmsg(pcVar10);
          return *status;
        }
        ffkeyn("TLMIN",*local_398,keyname,status);
        iVar4 = ffgky(fptr,0x52,keyname,(double *)((long)amin + lVar12),(char *)0x0,status);
        if (0 < iVar4) {
          *status = 0;
          iVar4 = fits_get_col_minmax(fptr,*local_398,(double *)((long)amin + lVar12),&datamax,
                                      status);
          if (iVar4 < 1) goto LAB_001b65f9;
LAB_001b6d62:
          pcVar10 = errmsg;
          builtin_strncpy(errmsg,"Error calculating datamin and datamax for column: ",0x33);
          sVar6 = strlen(pcVar10);
          strncat(pcVar10,*local_3c0,0x50 - sVar6);
          goto LAB_001b6df5;
        }
LAB_001b65f9:
        pdVar2 = local_330;
        pacVar11 = local_350;
        if (((*local_350)[0] != '\0') &&
           (iVar4 = ffgky(fptr,0x52,*local_350,(void *)((long)local_330 + lVar12),(char *)0x0,status
                         ), iVar4 != 0)) {
          ffpmsg("error reading histogramming maximum keyword");
          goto LAB_001b6cbc;
        }
        dVar17 = *(double *)((long)pdVar2 + lVar12);
        if ((dVar17 != -9.1191291391491e-36) || (NAN(dVar17))) {
          *(double *)((long)amax + lVar12) = dVar17;
        }
        else if (((bVar3) || (pcVar10 = *(char **)((long)colexpr + lVar12), pcVar10 == (char *)0x0))
                || (*pcVar10 == '\0')) {
          ffkeyn("TLMAX",*local_398,keyname,status);
          pdVar2 = (double *)((long)amax + lVar12);
          iVar4 = ffgky(fptr,0x52,keyname,pdVar2,(char *)0x0,status);
          local_3a0 = 1;
          if (0 < iVar4) {
            *status = 0;
            if ((datamax != -9.1191291391491e-36) || (NAN(datamax))) {
              *pdVar2 = datamax;
              goto LAB_001b676a;
            }
            iVar4 = fits_get_col_minmax(fptr,*local_398,&datamin,pdVar2,status);
            local_3a0 = 1;
            if (0 < iVar4) goto LAB_001b6d62;
          }
        }
        else {
          iVar4 = fits_get_expr_minmax
                            (fptr,pcVar10,&datamin,(double *)((long)amax + lVar12),(int *)0x0,status
                            );
          if (0 < iVar4) goto LAB_001b6db1;
          dVar17 = *(double *)((long)amax + lVar12);
          local_3a0 = 1;
          if ((dVar17 == -9.1191291391491e-36) && (!NAN(dVar17))) {
            *(undefined8 *)((long)amin + lVar12) = 0x3ff0000000000000;
LAB_001b676a:
            local_3a0 = 1;
          }
        }
        if (((*local_380)[0] != '\0') &&
           (iVar4 = ffgky(fptr,0x52,*local_380,(void *)((long)binsizein + lVar12),(char *)0x0,status
                         ), pacVar11 = local_380, iVar4 != 0)) {
          ffpmsg("error reading histogramming binsize keyword");
LAB_001b6cbc:
          ffpmsg(*pacVar11);
          return *status;
        }
        piVar8 = local_358;
        dVar17 = *(double *)((long)binsizein + lVar12);
        if ((dVar17 == 0.0) && (!NAN(dVar17))) {
          ffpmsg("error: histogram binsize = 0");
          *status = 0x142;
          return 0x142;
        }
        if ((dVar17 != -9.1191291391491e-36) || (NAN(dVar17))) {
          *(double *)((long)binsize + lVar12) = dVar17;
        }
        else {
          tstatus = 0;
          if (((bVar3) || (*(char **)((long)colexpr + lVar12) == (char *)0x0)) ||
             (**(char **)((long)colexpr + lVar12) == '\0')) {
            ffkeyn("TDBIN",*local_398,keyname,&tstatus);
            minin = local_338;
            ffgky(fptr,0x52,keyname,(void *)((long)binsizein + lVar12),(char *)0x0,&tstatus);
            if ((tstatus == 0) &&
               (((bVar3 || (*(char **)((long)colexpr + lVar12) == (char *)0x0)) ||
                (**(char **)((long)colexpr + lVar12) == '\0')))) goto LAB_001b681a;
          }
          dVar17 = (*(double *)((long)amax + lVar12) - *(double *)((long)amin + lVar12)) / 10.0;
          *(double *)((long)binsize + lVar12) = dVar17;
          if (1.0 < dVar17) {
            *(undefined8 *)((long)binsize + lVar12) = 0x3ff0000000000000;
          }
        }
LAB_001b681a:
        dVar17 = *(double *)((long)amin + lVar12);
        uVar13 = SUB84(dVar17,0);
        uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
        dVar15 = *(double *)((long)amax + lVar12);
        if (((dVar15 < dVar17) && (dVar16 = *(double *)((long)binsize + lVar12), 0.0 < dVar16)) ||
           ((dVar16 = *(double *)((long)binsize + lVar12), dVar17 < dVar15 && (dVar16 < 0.0)))) {
          dVar16 = -dVar16;
          *(double *)((long)binsize + lVar12) = dVar16;
          uVar13 = (undefined4)*(undefined8 *)((long)amin + lVar12);
          uVar14 = (undefined4)((ulong)*(undefined8 *)((long)amin + lVar12) >> 0x20);
          dVar15 = *(double *)((long)amax + lVar12);
        }
        if (datatype < 0x2a) {
          if (((double)CONCAT44(uVar14,uVar13) != (double)(int)(double)CONCAT44(uVar14,uVar13)) ||
             (NAN((double)CONCAT44(uVar14,uVar13)) ||
              NAN((double)(int)(double)CONCAT44(uVar14,uVar13)))) goto LAB_001b6938;
          if ((dVar15 != (double)(int)dVar15) || (NAN(dVar15) || NAN((double)(int)dVar15)))
          goto LAB_001b6938;
          if ((dVar16 != (double)(int)dVar16) || (NAN(dVar16) || NAN((double)(int)dVar16)))
          goto LAB_001b6938;
          *(long *)((long)haxes + lVar12) =
               (long)(((int)dVar15 - (int)(double)CONCAT44(uVar14,uVar13)) / (int)dVar16 + 1);
          if (dVar15 < (double)CONCAT44(uVar14,uVar13) || dVar15 == (double)CONCAT44(uVar14,uVar13))
          {
            *(double *)((long)amin + lVar12) = (double)CONCAT44(uVar14,uVar13) + 0.5;
            dVar17 = *(double *)((long)amax + lVar12) + -0.5;
          }
          else {
            *(double *)((long)amin + lVar12) = (double)CONCAT44(uVar14,uVar13) + -0.5;
            dVar17 = *(double *)((long)amax + lVar12) + 0.5;
          }
          *(double *)((long)amax + lVar12) = dVar17;
          goto LAB_001b6af1;
        }
LAB_001b6938:
        dVar17 = (dVar15 - (double)CONCAT44(uVar14,uVar13)) / dVar16;
        if ((int)local_3a0 == 0) {
          lVar5 = (long)dVar17;
          *(long *)((long)haxes + lVar12) = lVar5;
          dVar17 = (double)lVar5 * dVar16 + (double)CONCAT44(uVar14,uVar13);
          if (dVar15 < (double)CONCAT44(uVar14,uVar13) || dVar15 == (double)CONCAT44(uVar14,uVar13))
          {
            if (dVar15 < dVar17) goto LAB_001b6aea;
          }
          else if (dVar17 < dVar15) {
LAB_001b6aea:
            lVar5 = lVar5 + 1;
            goto LAB_001b6aed;
          }
        }
        else {
          lVar5 = (long)(dVar17 + 1.0);
LAB_001b6aed:
          *(long *)((long)haxes + lVar12) = lVar5;
        }
LAB_001b6af1:
        local_388 = local_388 + 1;
        local_368 = local_368 + 0x10;
        binname = local_380 + 1;
        local_350 = local_350 + 1;
        minname = local_390 + 1;
        piVar8 = piVar8 + 1;
        local_360 = local_360 + 1;
        local_3c0 = local_3c0 + 1;
      }
      iVar4 = *status;
    }
    else {
      ffpmsg("histograms with more than 4 dimensions are not supported");
      *status = 0x140;
LAB_001b61a5:
      iVar4 = 0x140;
    }
  }
  return iVar4;
code_r0x001b6b53:
  pcVar10 = pcVar10 + 1;
  goto LAB_001b6b43;
code_r0x001b6b83:
  __dest = __dest + 1;
  goto LAB_001b6b6d;
}

Assistant:

int fits_calc_binningde(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      char *colexpr[4],  /* I - optional column expression instead of name*/
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      int *datatypes,  /* O - datatypes of each output column */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      long *repeat,     /* O - vector repeat of input columns */
      int *status)
/*_
    Calculate the actual binning parameters, based on various user input
    options.

    Note: caller is responsible to free parsers[*] upon return using ffcprs()
*/
{
    tcolumn *colptr;
    char *cptr, cpref[4][FLEN_VALUE];
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD];
    int tstatus, ii;
    int datatype, imin, imax, ibin,  use_datamax = 0;
    long repeat1;
    double datamin, datamax;
    int ncols;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Initialize the number of iterator columns required */
    if (repeat)    (*repeat) = 0;

    if (naxis > 4)
    {
        ffpmsg("histograms with more than 4 dimensions are not supported");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);
    
    /* ============================================================= */
    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    *cpref[0] = '\0';
    *cpref[1] = '\0';
    *cpref[2] = '\0';
    *cpref[3] = '\0';

    tstatus = 0;
    ffgky(fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    /* ============================================================= */
    /* Main Loop for calculating parameters for each column          */

    for (ii = 0; ii < naxis; ii++)
    {

      /* =========================================================== */
      /* Determine column Number, based on, in order of priority,
         1  input column name, or
	 2  name given by CPREF keyword, or
	 3  assume X, Y, Z and T for the name
      */

      if (*colname[ii] == '\0' && 
	  (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0'))
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      colnum[ii] = 0;
      if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
	if (ffgcno(fptr, CASEINSEN, colname[ii], colnum+ii, status) > 0)
	  {
	    strcpy(errmsg, "column for histogram axis doesn't exist: ");
	    strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	    ffpmsg(errmsg);
	    return(*status);
	  }
	
	/* ================================================================ */
	/* check tha column is not a vector or a string                     */
	
	/* get the datatype of the column */
	fits_get_eqcoltype(fptr, colnum[ii], &datatype,
			   &repeat1, NULL, status);
	
	ncols = 1; /* Require only one iterator column, the actual column */

      } else { /* column expression: use parse to determine datatype and dimensions */

	long nelem, naxes[MAXDIMS];
	int naxis;
	ParseData lParse;

	/* Initialize the parser so that we can determine the datatype
	   of the returned type as well as the vector dimensions */
	if ( ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis,
		     naxes, &lParse, status ) ) {
	  snprintf(errmsg, FLEN_ERRMSG, 
		   "Parser error of binning expression: %s", 
		   colexpr[ii]);
	  ffpmsg(errmsg);
	  return *status;
	}
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	repeat1 = nelem;

	/* We require lParse.nCols columns to be read from input,
	   plus one for the Temporary calculator result */
	ncols = lParse.nCols + 1;
	ffcprs( &lParse );
      }

      /* Not sure why this repeat limitation is here -- CM
	 The iterator system can handle vector columns just fine
`       */
      if (datatype < 0 || datatype == TSTRING)
      {
	strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
	strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
	ffpmsg(errmsg);
	return(*status = BAD_DATATYPE);
      }

      /* Store repeat value for future use */
      if (repeat) {
	if (ii == 0) {
	  *repeat = repeat1; /* First time around save the repeat value */

	} else if (*repeat != repeat1) { /* later dimensions, keep same dims */

	  strcpy(errmsg, "Vector repeat of input columns do not agree");
	  ffpmsg(errmsg);
	  return (*status = BAD_DIMEN);
	}
      }

      if (datatypes) datatypes[ii] = datatype;

      /* ================================================================ */
      /* get the minimum value */

      datamin = DOUBLENULLVALUE;
      datamax = DOUBLENULLVALUE;
      
      if (*minname[ii])
      {
         if (ffgky(fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (minin[ii] != DOUBLENULLVALUE)
      {
        amin[ii] = (double) minin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMIN", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(fptr, colnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      } else { /* it's an expression */
	if (fits_get_expr_minmax(fptr, colexpr[ii], amin+ii, &datamax, 0, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
                ffpmsg(errmsg);
		ffpmsg(colexpr[ii]);
                return(*status);
            }
	if (amin[ii] == DOUBLENULLVALUE) amin[ii] = 0.0;
	
      }

      /* ================================================================ */
      /* get the maximum value */

      if (*maxname[ii])
      {
         if (ffgky(fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (maxin[ii] != DOUBLENULLVALUE)
      {
        amax[ii] = (double) maxin[ii];
      }
      else if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
      {
        ffkeyn("TLMAX", colnum[ii], keyname, status);
        if (ffgky(fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(fptr, colnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */

      } else { /* it's an expression */

	if (fits_get_expr_minmax(fptr, colexpr[ii], &datamin, &amax[ii], 0, status) > 0)
	{
	  strcpy(errmsg, "Error calculating datamin and datamax for expression: ");
	  ffpmsg(errmsg);
	  ffpmsg(colexpr[ii]);
	  return(*status);
	}
	if (amax[ii] == DOUBLENULLVALUE) amin[ii] = 1.0;
        use_datamax = 1;  
      }


      /* ================================================================ */
      /* determine binning size and range                                 */

      if (*binname[ii])
      {
         if (ffgky(fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] != DOUBLENULLVALUE)
      { 
         binsize[ii] = (double) binsizein[ii];
      }
      else
      {
         tstatus = 0;

	 if (colexpr == 0 || colexpr[ii] == 0 || colexpr[ii][0] == '\0')
	 {
	   ffkeyn("TDBIN", colnum[ii], keyname, &tstatus);
	   ffgky(fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus);
	 }

         if (tstatus || 
	     colexpr && colexpr[ii] && colexpr[ii][0]) {
	    /* make at least 10 bins */
            binsize[ii] = (amax[ii] - amin[ii]) / 10.F ;
            if (binsize[ii] > 1.)
                binsize[ii] = 1.;  /* use default bin size */
         }
      }

      /* ================================================================ */
      /* if the min is greater than the max, make the binsize negative */
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          binsize[ii] =  -binsize[ii];  /* reverse the sign of binsize */


      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
                               (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        haxes[ii] = (long) (((amax[ii] - amin[ii]) / binsize[ii]) + 1.); 
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        haxes[ii] = (long) ((amax[ii] - amin[ii]) / binsize[ii]);

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

    return(*status);
}